

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildAndTestHandler::cmCTestBuildAndTestHandler(cmCTestBuildAndTestHandler *this)

{
  duration<double,_std::ratio<1L,_1L>_> dVar1;
  cmCTestBuildAndTestHandler *this_local;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_011011a8;
  std::__cxx11::string::string((string *)&this->Output);
  std::__cxx11::string::string((string *)&this->BuildGenerator);
  std::__cxx11::string::string((string *)&this->BuildGeneratorPlatform);
  std::__cxx11::string::string((string *)&this->BuildGeneratorToolset);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->BuildOptions);
  std::__cxx11::string::string((string *)&this->BuildMakeProgram);
  std::__cxx11::string::string((string *)&this->ConfigSample);
  std::__cxx11::string::string((string *)&this->SourceDir);
  std::__cxx11::string::string((string *)&this->BinaryDir);
  std::__cxx11::string::string((string *)&this->BuildProject);
  std::__cxx11::string::string((string *)&this->TestCommand);
  std::__cxx11::string::string((string *)&this->BuildRunDir);
  std::__cxx11::string::string((string *)&this->ExecutableDirectory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->TestCommandArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->BuildTargets);
  this->BuildTwoConfig = false;
  this->BuildNoClean = false;
  this->BuildNoCMake = false;
  dVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  (this->Timeout).__r = dVar1.__r;
  return;
}

Assistant:

cmCTestBuildAndTestHandler::cmCTestBuildAndTestHandler()
{
  this->BuildTwoConfig = false;
  this->BuildNoClean = false;
  this->BuildNoCMake = false;
  this->Timeout = cmDuration::zero();
}